

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_throttle_conn(Ssh *ssh,int adjust)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ssh->conn_throttle_count;
  iVar2 = adjust + iVar1;
  ssh->conn_throttle_count = iVar2;
  if (iVar2 < 0) {
    __assert_fail("ssh->conn_throttle_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c",
                  0x370,"void ssh_throttle_conn(Ssh *, int)");
  }
  if ((iVar1 != 0) != (iVar2 == 0)) {
    return;
  }
  ssh->logically_frozen = iVar2 != 0 && iVar1 == 0;
  ssh_check_frozen(ssh);
  return;
}

Assistant:

void ssh_throttle_conn(Ssh *ssh, int adjust)
{
    int old_count = ssh->conn_throttle_count;
    bool frozen;

    ssh->conn_throttle_count += adjust;
    assert(ssh->conn_throttle_count >= 0);

    if (ssh->conn_throttle_count && !old_count) {
        frozen = true;
    } else if (!ssh->conn_throttle_count && old_count) {
        frozen = false;
    } else {
        return;                /* don't change current frozen state */
    }

    ssh->logically_frozen = frozen;
    ssh_check_frozen(ssh);
}